

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm7tdmi.c
# Opt level: O1

status_register_t * get_spsr(arm7tdmi_t *state)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = ((state->cpsr).raw & 0x1f) - 0x11;
  lVar2 = 0xb8;
  if (uVar1 < 0xb) {
    lVar2 = *(long *)(&DAT_00123d40 + (ulong)uVar1 * 8);
  }
  return (status_register_t *)((long)state->r + lVar2 + -0x38);
}

Assistant:

status_register_t* get_spsr(arm7tdmi_t* state) {
    switch (state->cpsr.mode) {
        case MODE_FIQ:
            return &state->spsr_fiq;
        case MODE_SUPERVISOR:
            return &state->spsr_svc;
        case MODE_ABORT:
            return &state->spsr_abt;
        case MODE_IRQ:
            return &state->spsr_irq;
        case MODE_UNDEFINED:
            return &state->spsr_und;
        default:
            return &state->spsr;
    }
}